

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall CLI::App::_validate(App *this)

{
  pointer puVar1;
  pointer pcVar2;
  difference_type dVar3;
  InvalidError *this_00;
  App_p *app;
  pointer puVar4;
  string local_40;
  
  dVar3 = ::std::
          __count_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::_validate()const::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>>
                    ((this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (dVar3 < 2) {
    puVar1 = (this->subcommands_).
             super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (this->subcommands_).
                  super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1)
    {
      _validate((puVar4->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
                super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl);
    }
    return;
  }
  this_00 = (InvalidError *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  pcVar2 = (this->name_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + (this->name_)._M_string_length);
  InvalidError::InvalidError(this_00,&local_40);
  __cxa_throw(this_00,&InvalidError::typeinfo,Error::~Error);
}

Assistant:

void _validate() const {
        auto count = std::count_if(std::begin(options_), std::end(options_), [](const Option_p &opt) {
            return opt->get_items_expected() < 0 && opt->get_positional();
        });
        if(count > 1)
            throw InvalidError(name_);
        for(const App_p &app : subcommands_)
            app->_validate();
    }